

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

unsigned_short __thiscall Am_Instance_Iterator::Length(Am_Instance_Iterator *this)

{
  uint *puVar1;
  Am_Object_Data *pAVar2;
  Am_Object_Data *pAVar3;
  unsigned_short uVar4;
  
  pAVar3 = (this->prototype).data;
  if ((pAVar3 == (Am_Object_Data *)0x0) || ((pAVar3->data).data == (char *)0x0)) {
    uVar4 = 0;
  }
  else {
    puVar1 = &(pAVar3->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
    pAVar2 = Am_Object_Data::Narrow(&pAVar3->super_Am_Wrapper);
    uVar4 = 0;
    for (pAVar3 = pAVar2->first_instance; pAVar3 != (Am_Object_Data *)0x0;
        pAVar3 = pAVar3->next_instance) {
      uVar4 = uVar4 + 1;
    }
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(pAVar2);
    }
  }
  return uVar4;
}

Assistant:

bool
Am_Object::Valid() const
{
  return (data != nullptr) && (data->data.data != nullptr);
}